

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O1

QString * __thiscall QTabBar::tabWhatsThis(QString *__return_storage_ptr__,QTabBar *this,int index)

{
  Data *pDVar1;
  long lVar2;
  
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  if ((ulong)(long)index < *(ulong *)(lVar2 + 0x2e8)) {
    lVar2 = *(long *)(*(long *)(lVar2 + 0x2e0) + (long)index * 8);
  }
  else {
    lVar2 = 0;
  }
  if (lVar2 == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pDVar1 = *(Data **)(lVar2 + 0x30);
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = *(char16_t **)(lVar2 + 0x38);
    (__return_storage_ptr__->d).size = *(qsizetype *)(lVar2 + 0x40);
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      return __return_storage_ptr__;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QTabBar::tabWhatsThis(int index) const
{
    Q_D(const QTabBar);
    if (const QTabBarPrivate::Tab *tab = d->at(index))
        return tab->whatsThis;
    return QString();
}